

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O2

ostream * operator<<(ostream *stream,LightEdge *e)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(stream,"(");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,")");
  return stream;
}

Assistant:

std::ostream &operator<<(std::ostream &stream, const Graph::LightEdge &e) {
    stream << "(" << e.u << ", " << e.v << ")";
    return stream;
}